

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_gnss_gal(fsnav_gnss_gal *gal,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  double *pdVar2;
  ulong local_30;
  size_t i;
  size_t max_eph_count_local;
  size_t max_sat_count_local;
  fsnav_gnss_gal *gal_local;
  
  gal->sat = (fsnav_gnss_sat *)0x0;
  gal->max_sat_count = 0;
  gal->max_eph_count = 0;
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gal->sat = pfVar1;
  if (gal->sat == (fsnav_gnss_sat *)0x0) {
    gal_local._7_1_ = '\0';
  }
  else {
    gal->max_sat_count = max_sat_count;
    for (local_30 = 0; local_30 < gal->max_sat_count; local_30 = local_30 + 1) {
      fsnav_init_gnss_sat(gal->sat + local_30);
    }
    for (local_30 = 0; local_30 < gal->max_sat_count; local_30 = local_30 + 1) {
      pdVar2 = (double *)calloc(max_eph_count,8);
      gal->sat[local_30].eph = pdVar2;
      if (gal->sat[local_30].eph == (double *)0x0) {
        return '\0';
      }
    }
    gal->max_eph_count = max_eph_count;
    gal->obs_types = (char (*) [4])0x0;
    gal->obs_count = 0;
    gal->iono_valid = '\0';
    gal->clock_corr_valid = '\0';
    gal_local._7_1_ = '\x01';
  }
  return gal_local._7_1_;
}

Assistant:

char fsnav_init_gnss_gal(fsnav_gnss_gal* gal, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gal->sat = NULL;
	gal->max_sat_count = 0;
	gal->max_eph_count = 0;

	// try to allocate memory for satellite data
	gal->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gal->sat == NULL)
		return 0;
	gal->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gal->max_sat_count; i++) 
		fsnav_init_gnss_sat(gal->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gal->max_sat_count; i++) {
		gal->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gal->sat[i].eph == NULL)
			return 0;
	}
	gal->max_eph_count = max_eph_count;

	// observation types
	gal->obs_types = NULL;
	gal->obs_count = 0;

	// validity flags
	gal->iono_valid = 0;
	gal->clock_corr_valid = 0;

	return 1;
}